

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

bool __thiscall SQBlob::Resize(SQBlob *this,SQInteger n)

{
  uchar *__s;
  uchar *newbuf;
  SQInteger n_local;
  SQBlob *this_local;
  
  if ((this->_owns & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (n != this->_allocated) {
      __s = (uchar *)sq_malloc(n);
      memset(__s,0,n);
      if (n < this->_size) {
        memcpy(__s,this->_buf,n);
      }
      else {
        memcpy(__s,this->_buf,this->_size);
      }
      sq_free(this->_buf,this->_allocated);
      this->_buf = __s;
      this->_allocated = n;
      if (this->_allocated < this->_size) {
        this->_size = this->_allocated;
      }
      if (this->_allocated < this->_ptr) {
        this->_ptr = this->_allocated;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Resize(SQInteger n) {
        if(!_owns) return false;
        if(n != _allocated) {
            unsigned char *newbuf = (unsigned char *)sq_malloc(n);
            memset(newbuf,0,n);
            if(_size > n)
                memcpy(newbuf,_buf,n);
            else
                memcpy(newbuf,_buf,_size);
            sq_free(_buf,_allocated);
            _buf=newbuf;
            _allocated = n;
            if(_size > _allocated)
                _size = _allocated;
            if(_ptr > _allocated)
                _ptr = _allocated;
        }
        return true;
    }